

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_platform_sdl2.c
# Opt level: O2

void FAudio_UTF8_To_UTF16(char *src,uint16_t *dst,size_t len)

{
  ulong uVar1;
  byte bVar2;
  byte *pbVar3;
  uint uVar4;
  int iVar5;
  
  while (uVar1 = len - 2, 1 < uVar1) {
    bVar2 = *src;
    uVar4 = (uint)bVar2;
    if (bVar2 == 0) break;
    if ((char)bVar2 < '\0') {
      if (bVar2 < 0xc0) {
LAB_00119d32:
        pbVar3 = (byte *)src + 1;
      }
      else if (bVar2 < 0xe0) {
        bVar2 = ((byte *)src)[1];
        if ((bVar2 & 0xffffffc0) != 0x80) goto LAB_00119d32;
        pbVar3 = (byte *)src + 2;
        if ((uVar4 * 0x40 + (uint)bVar2) - 0x3100 < 0x780) {
          uVar4 = (uVar4 * 0x40 + (uint)bVar2) - 0x3080;
          goto LAB_00119cda;
        }
      }
      else if (bVar2 < 0xf0) {
        pbVar3 = (byte *)src + 1;
        if ((((byte *)src)[1] & 0xc0) == 0x80) {
          bVar2 = ((byte *)src)[2];
          if ((bVar2 & 0xffffffc0) == 0x80) {
            pbVar3 = (byte *)src + 3;
            iVar5 = (uint)((byte *)src)[1] * 0x40 + uVar4 * 0x1000;
            if ((((1 < ((uint)bVar2 + iVar5) - 0xefbff) &&
                 (iVar5 = iVar5 + (uint)bVar2, 1 < iVar5 - 0xefc7fU)) &&
                ((iVar5 != 0xef880 && ((iVar5 != 0xf0000 && (iVar5 != 0xf007f)))))) &&
               (iVar5 - 0xe2880U < 0xf7fe)) {
              uVar4 = iVar5 - 0xe2080;
              goto LAB_00119cda;
            }
          }
        }
      }
      else if (bVar2 < 0xf8) {
        pbVar3 = (byte *)src + 1;
        if ((((((byte *)src)[1] & 0xc0) == 0x80) && ((((byte *)src)[2] & 0xc0) == 0x80)) &&
           (bVar2 = ((byte *)src)[3], (bVar2 & 0xc0) == 0x80)) {
          pbVar3 = (byte *)src + 4;
          iVar5 = (uint)((byte *)src)[2] * 0x40 + (uint)((byte *)src)[1] * 0x1000 + uVar4 * 0x40000;
          if ((uint)bVar2 + iVar5 + 0xfc36df80 < 0x100000) {
            uVar4 = (uint)bVar2 + iVar5 + 0xfc37df80;
            goto LAB_00119cda;
          }
        }
      }
      else {
        pbVar3 = (byte *)src + 1;
      }
LAB_00119d35:
      uVar4 = 0x3f;
    }
    else {
      pbVar3 = (byte *)src + 1;
LAB_00119cda:
      if (uVar4 == 0xffffffff) goto LAB_00119d35;
      if (uVar4 == 0) break;
      if (0xffff < uVar4) {
        if (uVar1 < 4) break;
        *dst = (ushort)(uVar4 + 0xf0000 >> 10) & 0x3ff | 0xd800;
        dst = dst + 1;
        uVar4 = uVar4 & 0x3ff | 0xdc00;
        uVar1 = len - 4;
      }
    }
    len = uVar1;
    *dst = (uint16_t)uVar4;
    dst = dst + 1;
    src = (char *)pbVar3;
  }
  *dst = 0;
  return;
}

Assistant:

void FAudio_UTF8_To_UTF16(const char *src, uint16_t *dst, size_t len)
{
    len -= sizeof (uint16_t);   /* save room for null char. */
    while (len >= sizeof (uint16_t))
    {
        uint32_t cp = FAudio_UTF8_CodePoint(&src);
        if (cp == 0)
            break;
        else if (cp == UNICODE_BOGUS_CHAR_VALUE)
            cp = UNICODE_BOGUS_CHAR_CODEPOINT;

        if (cp > 0xFFFF)  /* encode as surrogate pair */
        {
            if (len < (sizeof (uint16_t) * 2))
                break;  /* not enough room for the pair, stop now. */

            cp -= 0x10000;  /* Make this a 20-bit value */

            *(dst++) = 0xD800 + ((cp >> 10) & 0x3FF);
            len -= sizeof (uint16_t);

            cp = 0xDC00 + (cp & 0x3FF);
        } /* if */

        *(dst++) = cp;
        len -= sizeof (uint16_t);
    } /* while */

    *dst = 0;
}